

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_of_detail.c
# Opt level: O0

bool_t prf_level_of_detail_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict5 *data;
  int pos;
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  uint16_t in_stack_ffffffffffffffce;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar1;
  
  if (*in_RDI == prf_level_of_detail_info.opcode) {
    bf_put_uint16_be(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    bf_put_uint16_be(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    bf_write(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             (uint)((ulong)in_RDI >> 0x20));
    bf_put_int32_be(bfile_00,CONCAT22(in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc));
    bf_put_float64_be(bfile_00,(float64_t)
                               CONCAT26(in_stack_ffffffffffffffce,
                                        CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                )));
    bf_put_float64_be(bfile_00,(float64_t)
                               CONCAT26(in_stack_ffffffffffffffce,
                                        CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                )));
    bf_put_int16_be(bfile_00,in_stack_ffffffffffffffce);
    bf_put_int16_be(bfile_00,in_stack_ffffffffffffffce);
    bf_put_int32_be(bfile_00,CONCAT22(in_stack_ffffffffffffffce,in_stack_ffffffffffffffcc));
    bf_put_float64_be(bfile_00,(float64_t)
                               CONCAT26(in_stack_ffffffffffffffce,
                                        CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                )));
    bf_put_float64_be(bfile_00,(float64_t)
                               CONCAT26(in_stack_ffffffffffffffce,
                                        CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                )));
    bf_put_float64_be(bfile_00,(float64_t)
                               CONCAT26(in_stack_ffffffffffffffce,
                                        CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                )));
    bf_put_float64_be(bfile_00,(float64_t)
                               CONCAT26(in_stack_ffffffffffffffce,
                                        CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                )));
    if (0x48 < in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
    }
    bVar1 = 1;
  }
  else {
    prf_error(9,"tried level of detail save method on node of type %d.",(ulong)*in_RDI);
    bVar1 = 0;
  }
  return bVar1;
}

Assistant:

static bool_t
prf_level_of_detail_save_f(prf_node_t * node,
                           prf_state_t * state,
                           bfile_t * bfile)
{
  int pos;

  assert(node != NULL && bfile != NULL);

  if (node->opcode != prf_level_of_detail_info.opcode) {
    prf_error(9, "tried level of detail save method on node of type %d.",
              node->opcode);
    return FALSE;
  }

  bf_put_uint16_be(bfile, node->opcode);
  bf_put_uint16_be(bfile, node->length);

  pos = 4;
  do {
    node_data * data;
    data = (node_data *) node->data;

    bf_write(bfile, data->id, 8); pos += 8;
    bf_put_int32_be(bfile, data->reserved); pos += 4;
    bf_put_float64_be(bfile, data->switch_in_distance); pos += 8;
    bf_put_float64_be(bfile, data->switch_out_distance); pos += 8;
    bf_put_int16_be(bfile, data->special_effect_id1); pos += 2;
    bf_put_int16_be(bfile, data->special_effect_id2); pos += 2;
    bf_put_int32_be(bfile, data->flags); pos += 4;
    bf_put_float64_be(bfile, data->center_x); pos += 8;
    bf_put_float64_be(bfile, data->center_y); pos += 8;
    bf_put_float64_be(bfile, data->center_z); pos += 8;
    bf_put_float64_be(bfile, data->transition_range); pos += 8;

  } while (FALSE);
  
  if (node->length > pos) {
    pos += bf_write(bfile, node->data + pos - 4 + NODE_DATA_PAD,
                    node->length - pos);
  }
  return TRUE;
}